

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpretedLiteralEvaluator.cpp
# Opt level: O0

bool __thiscall
Kernel::InterpretedLiteralEvaluator::IntEvaluator::tryEvaluateUnaryFunc
          (IntEvaluator *this,Interpretation op,Value *arg,Value *res)

{
  byte bVar1;
  IntegerConstantType *in_RDX;
  undefined4 in_ESI;
  IntegerConstantType *in_stack_ffffffffffffff38;
  IntegerConstantType *in_stack_ffffffffffffff40;
  IntegerConstantType *this_00;
  undefined8 in_stack_ffffffffffffff48;
  int v;
  IntegerConstantType *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  IntegerConstantType *in_stack_ffffffffffffff68;
  IntegerConstantType local_88 [5];
  IntegerConstantType local_38 [3];
  bool local_1;
  
  v = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  switch(in_ESI) {
  case 0x17:
    this_00 = local_88;
    IntegerConstantType::IntegerConstantType(in_stack_ffffffffffffff50,v);
    IntegerConstantType::operator+
              (in_stack_ffffffffffffff68,
               (IntegerConstantType *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60))
    ;
    IntegerConstantType::operator=(this_00,in_RDX);
    IntegerConstantType::~IntegerConstantType((IntegerConstantType *)0x879f6c);
    IntegerConstantType::~IntegerConstantType((IntegerConstantType *)0x879f76);
    local_1 = true;
    break;
  case 0x18:
    IntegerConstantType::operator-(local_38);
    IntegerConstantType::operator=(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    IntegerConstantType::~IntegerConstantType((IntegerConstantType *)0x879e00);
    local_1 = true;
    break;
  default:
    local_1 = false;
    break;
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x25:
    IntegerConstantType::operator=(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    local_1 = true;
    break;
  case 0x26:
    IntegerConstantType::IntegerConstantType(in_RDX,v);
    bVar1 = Kernel::operator<(in_stack_ffffffffffffff38,(IntegerConstantType *)0x879e60);
    IntegerConstantType::~IntegerConstantType((IntegerConstantType *)0x879e70);
    if ((bVar1 & 1) == 0) {
      IntegerConstantType::operator=(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    }
    else {
      IntegerConstantType::operator-(in_stack_ffffffffffffff68);
      IntegerConstantType::operator=(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      IntegerConstantType::~IntegerConstantType((IntegerConstantType *)0x879eaf);
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

virtual bool tryEvaluateUnaryFunc(Interpretation op, const Value& arg, Value& res)
  {
    switch(op) {
    case Theory::INT_UNARY_MINUS:
      res = -arg;
      return true;
    case Theory::INT_ABS:
      if (arg < IntegerConstantType(0)) {
        res = -arg;
      } else {
        res = arg;
      }
      return true;
    case Theory::INT_SUCCESSOR:
      res = arg+ IntegerConstantType(1);
      return true;
    case Theory::INT_FLOOR:
    case Theory::INT_CEILING:
    case Theory::INT_TRUNCATE:
    case Theory::INT_ROUND:
       // For integers these do nothing
      res = arg;
      return true;
    default:
      return false;
    }
  }